

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.cpp
# Opt level: O1

void Diligent::AppendLine1Marker(string *Source,char *FileName)

{
  std::__cxx11::string::append((char *)Source);
  if (FileName != (char *)0x0) {
    std::__cxx11::string::append((char *)Source);
    std::__cxx11::string::append((char *)Source);
    std::__cxx11::string::append((char *)Source);
  }
  std::__cxx11::string::append((char *)Source);
  return;
}

Assistant:

void AppendLine1Marker(std::string& Source, const char* FileName)
{
    Source.append("#line 1");
    if (FileName != nullptr)
    {
        Source.append(" \"");
        Source.append(FileName);
        Source.append("\"");
    }
    Source.append("\n");
}